

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O3

int __thiscall
dit::anon_unknown_0::CaseListParserTests::init(CaseListParserTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"trie",
             "Test case trie parser tests");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00270050;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"list",
             "Test case list parser tests");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00270448;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new TrieParserTests(m_testCtx));
		addChild(new ListParserTests(m_testCtx));
	}